

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zobrist.h
# Opt level: O0

uint64_t libchess::zobrist::piece_square_key(Square square,PieceType piece_type,Color color)

{
  bool bVar1;
  value_type vVar2;
  PieceType in_EDX;
  undefined4 in_ESI;
  MetaValueType<int> in_EDI;
  Piece unaff_retaddr;
  int i;
  int piece_offset;
  Piece piece;
  int local_20;
  int local_1c;
  Color in_stack_fffffffffffffff0;
  
  Piece::Piece((Piece *)CONCAT44(in_ESI,in_EDX.super_MetaValueType<int>.value_),in_EDX,
               in_stack_fffffffffffffff0);
  local_1c = -1;
  local_20 = 0;
  do {
    if (0xb < local_20) {
LAB_0010e7ac:
      vVar2 = MetaValueType<int>::value((MetaValueType<int> *)&stack0xfffffffffffffffc);
      return *(uint64_t *)(polyglot::random_u64 + (long)(local_1c * 0x40 + vVar2) * 8);
    }
    bVar1 = Piece::operator==((Piece *)CONCAT44(in_EDI.value_,in_ESI),unaff_retaddr);
    if (bVar1) {
      local_1c = local_20;
      goto LAB_0010e7ac;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

constexpr inline std::uint64_t piece_square_key(Square square, PieceType piece_type, Color color) {
    Piece piece = Piece{piece_type, color};
    int piece_offset = -1;
    for (int i = 0; i < 12; ++i) {
        if (constants::PIECES[i] == piece) {
            piece_offset = i;
            break;
        }
    }
    return polyglot::random_u64[piece_offset * 64 + square.value()];
}